

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_shift.c
# Opt level: O2

int BN_rshift(BIGNUM *r,BIGNUM *a,int n)

{
  int iVar1;
  ulong *puVar2;
  ulong *puVar3;
  sbyte sVar4;
  int iVar5;
  BIGNUM *pBVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  
  if (n < 0) {
    return 0;
  }
  uVar10 = (uint)n >> 6;
  if ((int)uVar10 < a->top) {
    iVar5 = BN_num_bits(a);
    iVar5 = ((iVar5 - n) + 0x3f) / 0x40;
    if (r == a) {
      if (n == 0) {
        return 1;
      }
    }
    else {
      r->neg = a->neg;
      pBVar6 = bn_wexpand((BIGNUM *)r,iVar5);
      if (pBVar6 == (BIGNUM *)0x0) {
        return 0;
      }
    }
    puVar2 = a->d;
    puVar3 = r->d;
    iVar1 = a->top;
    r->top = iVar5;
    if ((n & 0x3fU) == 0) {
      for (lVar9 = 0; iVar1 - uVar10 != (int)lVar9; lVar9 = lVar9 + 1) {
        puVar3[lVar9] = puVar2[(ulong)uVar10 + lVar9];
      }
    }
    else {
      sVar4 = (sbyte)(n & 0x3fU);
      puVar2 = puVar2 + uVar10;
      uVar7 = *puVar2;
      for (lVar9 = 0; ~uVar10 + iVar1 != (int)lVar9; lVar9 = lVar9 + 1) {
        uVar8 = uVar7 >> sVar4;
        uVar7 = puVar2[lVar9 + 1];
        puVar3[lVar9] = uVar7 << (0x40U - sVar4 & 0x3f) | uVar8;
      }
      if (uVar7 >> sVar4 != 0) {
        puVar3[lVar9] = uVar7 >> sVar4;
      }
    }
  }
  else {
    BN_zero_ex((BIGNUM *)r);
  }
  return 1;
}

Assistant:

int BN_rshift(BIGNUM *r, const BIGNUM *a, int n)
{
    int i, j, nw, lb, rb;
    BN_ULONG *t, *f;
    BN_ULONG l, tmp;

    bn_check_top(r);
    bn_check_top(a);

    if (n < 0) {
        //BNerr(BN_F_BN_RSHIFT, BN_R_INVALID_SHIFT);
        return 0;
    }

    nw = n / BN_BITS2;
    rb = n % BN_BITS2;
    lb = BN_BITS2 - rb;
    if (nw >= a->top || a->top == 0) {
        BN_zero(r);
        return (1);
    }
    i = (BN_num_bits(a) - n + (BN_BITS2 - 1)) / BN_BITS2;
    if (r != a) {
        r->neg = a->neg;
        if (bn_wexpand(r, i) == NULL)
            return (0);
    } else {
        if (n == 0)
            return 1;           /* or the copying loop will go berserk */
    }

    f = &(a->d[nw]);
    t = r->d;
    j = a->top - nw;
    r->top = i;

    if (rb == 0) {
        for (i = j; i != 0; i--)
            *(t++) = *(f++);
    } else {
        l = *(f++);
        for (i = j - 1; i != 0; i--) {
            tmp = (l >> rb) & BN_MASK2;
            l = *(f++);
            *(t++) = (tmp | (l << lb)) & BN_MASK2;
        }
        if ((l = (l >> rb) & BN_MASK2))
            *(t) = l;
    }
    bn_check_top(r);
    return (1);
}